

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  cmMakefile *pcVar1;
  undefined8 item;
  bool bVar2;
  int iVar3;
  cmLinkImplementationLibraries *this_00;
  string *psVar4;
  string *in_base;
  bool local_389;
  cmListFileBacktrace local_358;
  undefined1 local_348 [8];
  EvaluatedTargetPropertyEntry ee;
  undefined1 local_2e8 [8];
  string libDir;
  cmLinkImplItem *lib;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range3;
  cmLinkImplementationLibraries *impl;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  cmValue local_208;
  cmValue val;
  allocator<char> local_1c9;
  undefined1 local_1c8 [8];
  string propertyName;
  string local_1a0;
  undefined1 local_180 [8];
  EvaluatedTargetPropertyEntries entries;
  undefined1 local_158 [6];
  bool debugIncludes;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *includes;
  
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker.CheckResult);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"INCLUDE_DIRECTORIES",&local_109);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8,this,&local_108,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_138);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_158,"CMAKE_DEBUG_TARGET_PROPERTIES",
             (allocator<char> *)&entries.field_0x1f);
  cmMakefile::GetDefExpandList
            (pcVar1,(string *)local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138,false);
  std::__cxx11::string::~string((string *)local_158);
  std::allocator<char>::~allocator((allocator<char> *)&entries.field_0x1f);
  local_389 = false;
  if ((this->DebugIncludesDone & 1U) == 0) {
    local_389 = ::cm::
                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[20],_0>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138,(char (*) [20])0xd28d9b);
  }
  entries._30_1_ = local_389;
  bVar2 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
  if (bVar2) {
    this->DebugIncludesDone = true;
  }
  anon_unknown.dwarf_124178a::EvaluateTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)local_180,this,config,lang,
             (cmGeneratorExpressionDAGChecker *)local_e8,&this->IncludeDirectoriesEntries);
  bVar2 = std::operator==(lang,"Swift");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Swift_MODULE_DIRECTORY",
               (allocator<char> *)(propertyName.field_2._M_local_buf + 0xf));
    anon_unknown.dwarf_124178a::AddLangSpecificImplicitIncludeDirectories
              (this,lang,config,&local_1a0,BINARY,(EvaluatedTargetPropertyEntries *)local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)(propertyName.field_2._M_local_buf + 0xf));
  }
  bVar2 = CanCompileSources(this);
  if (((bVar2) && (bVar2 = std::operator!=(lang,"Swift"), bVar2)) &&
     (bVar2 = std::operator!=(lang,"Fortran"), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"ISPC_HEADER_DIRECTORY",&local_1c9);
    std::allocator<char>::~allocator(&local_1c9);
    GetAllConfigCompileLanguages_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&val,this);
    bVar2 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&val,(char (*) [5])"ISPC");
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&val);
    if (bVar2) {
      local_208 = GetProperty(this,(string *)local_1c8);
      bVar2 = cmValue::operator_cast_to_bool(&local_208);
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_208);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,psVar4);
      }
      else {
        GetObjectDirectory(&local_228,this,config);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"ISPC",&local_249);
    anon_unknown.dwarf_124178a::AddLangSpecificImplicitIncludeDirectories
              (this,&local_248,config,(string *)local_1c8,OBJECT,
               (EvaluatedTargetPropertyEntries *)local_180);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::__cxx11::string::~string((string *)local_1c8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"INTERFACE_INCLUDE_DIRECTORIES",&local_271);
  anon_unknown.dwarf_124178a::AddInterfaceEntries
            (this,config,&local_270,lang,(cmGeneratorExpressionDAGChecker *)local_e8,
             (EvaluatedTargetPropertyEntries *)local_180,Yes,Usage);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"APPLE",(allocator<char> *)((long)&impl + 7));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)((long)&impl + 7));
  if ((bVar2) &&
     (this_00 = GetLinkImplementationLibraries(this,config,Usage),
     this_00 != (cmLinkImplementationLibraries *)0x0)) {
    __end3 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                       (&this_00->Libraries);
    lib = (cmLinkImplItem *)
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this_00->Libraries);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                       *)&lib), bVar2) {
      libDir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
           ::operator*(&__end3);
      psVar4 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)libDir.field_2._8_8_);
      in_base = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath((string *)local_2e8,psVar4,in_base);
      if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
           frameworkCheck == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                       ::frameworkCheck), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetIncludeDirectories::frameworkCheck,
                   "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &GetIncludeDirectories::frameworkCheck,&__dso_handle);
        __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::frameworkCheck);
      }
      bVar2 = cmsys::RegularExpression::find
                        (&GetIncludeDirectories::frameworkCheck,(string *)local_2e8);
      if (bVar2) {
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)&ee.ContextDependent,&GetIncludeDirectories::frameworkCheck,1);
        std::__cxx11::string::operator=((string *)local_2e8,(string *)&ee.ContextDependent);
        std::__cxx11::string::~string((string *)&ee.ContextDependent);
        item = libDir.field_2._8_8_;
        local_358.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_358.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_358);
        anon_unknown.dwarf_124178a::EvaluatedTargetPropertyEntry::EvaluatedTargetPropertyEntry
                  ((EvaluatedTargetPropertyEntry *)local_348,(cmLinkImplItem *)item,&local_358);
        cmListFileBacktrace::~cmListFileBacktrace(&local_358);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &ee.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                    .
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
        std::
        vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                  ((vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    *)local_180,(EvaluatedTargetPropertyEntry *)local_348);
        anon_unknown.dwarf_124178a::EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry
                  ((EvaluatedTargetPropertyEntry *)local_348);
      }
      std::__cxx11::string::~string((string *)local_2e8);
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&__end3);
    }
  }
  anon_unknown.dwarf_124178a::processIncludeDirectories
            (this,(EvaluatedTargetPropertyEntries *)local_180,__return_storage_ptr__,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult,(bool)(entries._30_1_ & 1));
  anon_unknown.dwarf_124178a::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker.CheckResult);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  if (this->Makefile->IsOn("APPLE")) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir = cmSystemTools::CollapseFullPath(
          lib.AsStr(), this->Makefile->GetHomeOutputDirectory());

        static cmsys::RegularExpression frameworkCheck(
          "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        if (!frameworkCheck.find(libDir)) {
          continue;
        }

        libDir = frameworkCheck.match(1);

        EvaluatedTargetPropertyEntry ee(lib, cmListFileBacktrace());
        ee.Values.emplace_back(std::move(libDir));
        entries.Entries.emplace_back(std::move(ee));
      }
    }
  }

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  return includes;
}